

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O1

void curses_delay_output(void)

{
  doupdate();
  usleep(50000);
  return;
}

Assistant:

void curses_delay_output(void)
{
    doupdate();
#if defined(WIN32)
    Sleep(45);
#else
    usleep(50 * 1000);
#endif
}